

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_ext(upb_encstate *e,upb_Extension *ext,_Bool is_message_set)

{
  _Bool _Var1;
  upb_MiniTableSub local_28;
  upb_MiniTableSubInternal sub;
  upb_Extension *puStack_18;
  _Bool is_message_set_local;
  upb_Extension *ext_local;
  upb_encstate *e_local;
  
  sub._7_1_ = is_message_set;
  puStack_18 = ext;
  ext_local = (upb_Extension *)e;
  if (is_message_set) {
    encode_msgset_item(e,ext);
  }
  else {
    _Var1 = upb_MiniTableField_IsSubMessage(&ext->ext->field_dont_copy_me__upb_internal_use_only);
    if (_Var1) {
      local_28.submsg_dont_copy_me__upb_internal_use_only =
           (upb_MiniTable *)&puStack_18->ext->sub_dont_copy_me__upb_internal_use_only;
    }
    else {
      local_28 = puStack_18->ext->sub_dont_copy_me__upb_internal_use_only;
    }
    encode_field((upb_encstate *)ext_local,(upb_Message *)&(puStack_18->data).str_val,
                 (upb_MiniTableSubInternal *)&local_28,
                 &puStack_18->ext->field_dont_copy_me__upb_internal_use_only);
  }
  return;
}

Assistant:

static void encode_ext(upb_encstate* e, const upb_Extension* ext,
                       bool is_message_set) {
  if (UPB_UNLIKELY(is_message_set)) {
    encode_msgset_item(e, ext);
  } else {
    upb_MiniTableSubInternal sub;
    if (upb_MiniTableField_IsSubMessage(&ext->ext->UPB_PRIVATE(field))) {
      sub.UPB_PRIVATE(submsg) = &ext->ext->UPB_PRIVATE(sub).UPB_PRIVATE(submsg);
    } else {
      sub.UPB_PRIVATE(subenum) =
          ext->ext->UPB_PRIVATE(sub).UPB_PRIVATE(subenum);
    }
    encode_field(e, (upb_Message*)&ext->data, &sub,
                 &ext->ext->UPB_PRIVATE(field));
  }
}